

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawTestCaseUtil.hpp
# Opt level: O0

string * __thiscall
vkt::Draw::ShaderSourceProvider::getSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderSourceProvider *this,Archive *archive,char *path)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  Resource *pRVar4;
  reference pvVar5;
  Resource *pRVar6;
  size_type sVar7;
  allocator<char> local_5e;
  allocator<unsigned_char> local_5d [13];
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> readBuffer;
  undefined1 local_30 [8];
  UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> resource;
  char *path_local;
  Archive *archive_local;
  
  resource.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data._8_8_ =
       archive;
  uVar3 = (**(code **)(*(long *)this + 0x10))(this,archive);
  de::DefaultDeleter<tcu::Resource>::DefaultDeleter
            ((DefaultDeleter<tcu::Resource> *)
             ((long)&readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  de::details::UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::UniquePtr
            ((UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)local_30,uVar3);
  pRVar4 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)local_30);
  iVar1 = (*pRVar4->_vptr_Resource[3])();
  std::allocator<unsigned_char>::allocator(local_5d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,(long)(iVar1 + 1),
             local_5d);
  std::allocator<unsigned_char>::~allocator(local_5d);
  pRVar4 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)local_30);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
  pRVar6 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)local_30);
  uVar2 = (*pRVar6->_vptr_Resource[3])();
  (*pRVar4->_vptr_Resource[2])(pRVar4,pvVar5,(ulong)uVar2);
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,sVar7 - 1);
  *pvVar5 = '\0';
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)pvVar5,&local_5e);
  std::allocator<char>::~allocator(&local_5e);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  de::details::UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::~UniquePtr
            ((UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string getSource (tcu::Archive& archive, const char* path)
	{
		de::UniquePtr<tcu::Resource> resource(archive.getResource(path));

		std::vector<deUint8> readBuffer(resource->getSize() + 1);
		resource->read(&readBuffer[0], resource->getSize());
		readBuffer[readBuffer.size() - 1] = 0;

		return std::string(reinterpret_cast<const char*>(&readBuffer[0]));
	}